

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

piece_count * __thiscall
libtorrent::aux::piece_picker::have_want(piece_count *__return_storage_ptr__,piece_picker *this)

{
  bool bVar1;
  int iVar2;
  bool local_21;
  piece_index_t local_20;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_1a [2];
  piece_index_t local_18;
  bool want_last;
  piece_picker *ppStack_10;
  bool have_last;
  piece_picker *this_local;
  
  ppStack_10 = this;
  iVar2 = num_pieces(this);
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_18,iVar2 + -1);
  want_last = have_piece(this,local_18);
  iVar2 = num_pieces(this);
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_20,iVar2 + -1);
  local_1a[0].m_val = (uchar)piece_priority(this,local_20);
  bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator!=
                    (local_1a,(strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                               *)&dont_download);
  __return_storage_ptr__->num_pieces = this->m_num_have - this->m_num_have_filtered;
  __return_storage_ptr__->pad_bytes = this->m_have_pad_bytes - this->m_have_filtered_pad_bytes;
  local_21 = false;
  if ((want_last & 1U) != 0) {
    local_21 = bVar1;
  }
  __return_storage_ptr__->last_piece = local_21;
  return __return_storage_ptr__;
}

Assistant:

piece_count piece_picker::have_want() const
	{
		bool const have_last = have_piece(piece_index_t(num_pieces() - 1));
		bool const want_last = piece_priority(piece_index_t(num_pieces() - 1)) != dont_download;
		piece_count ret{ m_num_have - m_num_have_filtered
			, m_have_pad_bytes - m_have_filtered_pad_bytes
			, have_last && want_last };
		TORRENT_ASSERT(!(ret.num_pieces == 0 && ret.last_piece == true));
		TORRENT_ASSERT(!(ret.num_pieces == 0 && ret.pad_bytes > 0));
		TORRENT_ASSERT(!(ret.num_pieces == num_pieces() && ret.last_piece == false));
		return ret;
	}